

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::
field<char[9],pstack::Mapper<pstack::ProgramHeaderName,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::map<unsigned_int,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>>>>,pstack::Elf::Object_const*>
          (JObject *this,char (*k) [9],
          Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
          *v,Object **c)

{
  ostream *os;
  JSON<pstack::Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>,_const_pstack::Elf::Object_*>
  local_48;
  undefined1 local_38 [8];
  Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
  field;
  Object **c_local;
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  *v_local;
  char (*k_local) [9];
  JObject *this_local;
  
  field.v = (Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
             *)c;
  Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
  ::Field((Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
           *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[9],pstack::Mapper<pstack::ProgramHeaderName,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::map<unsigned_int,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>>>>>,pstack::Elf::Object_const*>
                       ((Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
                         *)local_38,(Object **)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }